

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

bool wallet::coinselector_tests::EquivalentResult(SelectionResult *a,SelectionResult *b)

{
  long lVar1;
  iterator iVar2;
  long *plVar3;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  long *plVar8;
  _Rb_tree_header *p_Var9;
  long *plVar10;
  long in_FS_OFFSET;
  vector<long,_std::allocator<long>_> b_amts;
  vector<long,_std::allocator<long>_> a_amts;
  long *local_68;
  long *plStack_60;
  long *local_58;
  long *local_48;
  iterator iStack_40;
  long *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (long *)0x0;
  local_48 = (long *)0x0;
  iStack_40._M_current = (long *)0x0;
  local_58 = (long *)0x0;
  local_68 = (long *)0x0;
  plStack_60 = (long *)0x0;
  psVar4 = SelectionResult::GetInputSet(a);
  p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var9) {
    do {
      if (iStack_40._M_current == local_38) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_48,iStack_40,
                   (long *)(*(long *)(p_Var5 + 1) + 0x48));
      }
      else {
        *iStack_40._M_current = *(long *)(*(long *)(p_Var5 + 1) + 0x48);
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var9);
  }
  psVar4 = SelectionResult::GetInputSet(b);
  p_Var6 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  plVar10 = local_48;
  iVar2._M_current = iStack_40._M_current;
  while (local_48 = plVar10, iStack_40._M_current = iVar2._M_current,
        (_Rb_tree_header *)p_Var6 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
    if (plStack_60 == local_58) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&local_68,(iterator)plStack_60,
                 (long *)(*(long *)(p_Var6 + 1) + 0x48));
    }
    else {
      *plStack_60 = *(long *)(*(long *)(p_Var6 + 1) + 0x48);
      plStack_60 = plStack_60 + 1;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    plVar10 = local_48;
    iVar2._M_current = iStack_40._M_current;
  }
  if (plVar10 != iVar2._M_current) {
    uVar7 = (long)iVar2._M_current - (long)plVar10 >> 3;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar10,iVar2._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar10,iVar2._M_current);
  }
  plVar3 = plStack_60;
  plVar10 = local_68;
  plVar8 = local_48;
  if (local_68 != plStack_60) {
    uVar7 = (long)plStack_60 - (long)local_68 >> 3;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68,plStack_60,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar10,plVar3);
    plVar8 = local_48;
    plVar10 = local_68;
  }
  for (; (iVar2._M_current = iStack_40._M_current, plVar3 = plStack_60,
         plVar8 != iStack_40._M_current && (*plVar8 == *plVar10)); plVar8 = plVar8 + 1) {
    plVar10 = plVar10 + 1;
  }
  if (local_68 != (long *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return plVar10 == plVar3 && plVar8 == iVar2._M_current;
  }
  __stack_chk_fail();
}

Assistant:

static bool EquivalentResult(const SelectionResult& a, const SelectionResult& b)
{
    std::vector<CAmount> a_amts;
    std::vector<CAmount> b_amts;
    for (const auto& coin : a.GetInputSet()) {
        a_amts.push_back(coin->txout.nValue);
    }
    for (const auto& coin : b.GetInputSet()) {
        b_amts.push_back(coin->txout.nValue);
    }
    std::sort(a_amts.begin(), a_amts.end());
    std::sort(b_amts.begin(), b_amts.end());

    std::pair<std::vector<CAmount>::iterator, std::vector<CAmount>::iterator> ret = std::mismatch(a_amts.begin(), a_amts.end(), b_amts.begin());
    return ret.first == a_amts.end() && ret.second == b_amts.end();
}